

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdio_file_writer.cc
# Opt level: O3

void __thiscall draco::StdioFileWriter::~StdioFileWriter(StdioFileWriter *this)

{
  (this->super_FileWriterInterface)._vptr_FileWriterInterface =
       (_func_int **)&PTR__StdioFileWriter_00181110;
  fclose((FILE *)this->file_);
  operator_delete(this,0x10);
  return;
}

Assistant:

std::unique_ptr<FileWriterInterface> StdioFileWriter::Open(
    const std::string &file_name) {
  if (file_name.empty()) {
    return nullptr;
  }
  if (!CheckAndCreatePathForFile(file_name)) {
    return nullptr;
  }

  FILE *raw_file_ptr = fopen(file_name.c_str(), "wb");
  if (raw_file_ptr == nullptr) {
    return nullptr;
  }

  std::unique_ptr<StdioFileWriter> file(new (std::nothrow)
                                            StdioFileWriter(raw_file_ptr));
  if (file == nullptr) {
    FILEWRITER_LOG_ERROR("Out of memory");
    fclose(raw_file_ptr);
    return nullptr;
  }

#ifndef DRACO_OLD_GCC
  return file;
#else
  return std::move(file);
#endif
}